

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

boolean obj_is_local(obj *obj)

{
  monst **ppmVar1;
  
  do {
    switch(((monst *)obj)->mtrack[2].x) {
    case '\x01':
    case '\x05':
      return '\x01';
    case '\x02':
      obj = (obj *)((vptrs *)&((monst *)obj)->data)->v_ocarry;
      break;
    case '\x03':
    case '\a':
      return '\0';
    case '\x04':
      ppmVar1 = &migrating_mons;
      while (ppmVar1 = &((monst *)ppmVar1)->nmon->nmon, (monst *)ppmVar1 != (monst *)0x0) {
        if ((monst *)ppmVar1 == (monst *)((monst *)obj)->data) {
          return '\0';
        }
      }
      ppmVar1 = &mydogs;
      do {
        ppmVar1 = &((monst *)ppmVar1)->nmon->nmon;
        if ((monst *)ppmVar1 == (monst *)0x0) {
          return '\x01';
        }
      } while ((monst *)ppmVar1 != (monst *)((monst *)obj)->data);
      return '\0';
    default:
      panic("obj_is_local");
    }
  } while( true );
}

Assistant:

boolean obj_is_local(struct obj *obj)
{
    switch (obj->where) {
	case OBJ_INVENT:
	case OBJ_MAGIC_CHEST:	return FALSE;
	case OBJ_FLOOR:
	case OBJ_BURIED:	return TRUE;
	case OBJ_CONTAINED:	return obj_is_local(obj->ocontainer);
	case OBJ_MINVENT:	return mon_is_local(obj->ocarry);
    }
    panic("obj_is_local");
    return FALSE;
}